

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

void test_dual_storage_with_tuple_copy_ctor(void)

{
  bool bVar1;
  reference_type l;
  markable<mark_interval,_ak_toolkit::markable_ns::order_none> local_20;
  opt_interval o2;
  DateInterval local_10;
  DateInterval i12;
  
  reset_Interval_count();
  Date::Date(&o2._storage.value_._value._last,1);
  Date::Date((Date *)&o2,2);
  DateInterval::DateInterval(&local_10,&o2._storage.value_._value._last,(Date *)&o2);
  bVar1 = count_Interval_value_copy_move_dtror(1,0,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 0, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,900,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::markable
            (&local_20,&local_10);
  bVar1 = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_20);
  if (!bVar1) {
    __assert_fail("o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x387,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  l = ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::value
                (&local_20);
  bVar1 = operator==(l,&local_10);
  if (!bVar1) {
    __assert_fail("o2.value() == i12",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x388,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  bVar1 = count_Interval_value_copy_move_dtror(1,1,0,0);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 1, 0, 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x389,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  ak_toolkit::markable_ns::markable<mark_interval,_ak_toolkit::markable_ns::order_none>::~markable
            (&local_20);
  DateInterval::~DateInterval(&local_10);
  bVar1 = count_Interval_value_copy_move_dtror(1,1,0,2);
  if (!bVar1) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 1, 0, 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x38b,"void test_dual_storage_with_tuple_copy_ctor()");
  }
  return;
}

Assistant:

void test_dual_storage_with_tuple_copy_ctor()
{
  reset_Interval_count();
  {
    typedef markable<mark_interval> opt_interval;
    DateInterval i12 {Date{1}, Date{2}};
    assert (count_Interval_value_copy_move_dtror(1, 0, 0, 0));

    opt_interval o2 {i12};
    assert (o2.has_value());
    assert (o2.value() == i12);
    assert (count_Interval_value_copy_move_dtror(1, 1, 0, 0));
  }
  assert (count_Interval_value_copy_move_dtror(1, 1, 0, 2));
}